

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O2

void __thiscall CLIntercept::logKernelInfo(CLIntercept *this,cl_kernel *kernels,cl_uint numKernels)

{
  cl_kernel kernel;
  cl_device_id *pp_Var1;
  char *pcVar2;
  byte bVar3;
  cl_int cVar4;
  cl_int cVar5;
  cl_int cVar6;
  ulong uVar7;
  undefined4 extraout_XMM0_Da;
  float __x;
  float fVar8;
  undefined4 extraout_XMM0_Db;
  cl_uint numDevices;
  uint local_10c;
  cl_uint regCount;
  cl_uint args;
  pthread_mutex_t *local_100;
  cl_device_id *deviceList;
  cl_int local_f0;
  cl_int local_ec;
  cl_int local_e8;
  cl_int local_e4;
  cl_int local_e0;
  cl_int local_dc;
  ulong local_d8;
  cl_ulong sms;
  cl_ulong lms;
  cl_ulong pms;
  size_t wgs;
  size_t pwgsm;
  size_t rwgs [3];
  cl_program program;
  char *deviceName;
  string local_50;
  
  if (numKernels != 0) {
    local_100 = (pthread_mutex_t *)&this->m_Mutex;
    local_10c = numKernels;
    std::mutex::lock((mutex *)&local_100->__data);
    program = (cl_program)0x0;
    cVar4 = (*(this->m_Dispatch).clGetKernelInfo)(*kernels,0x1194,8,&program,(size_t *)0x0);
    numDevices = 0;
    deviceList = (cl_device_id *)0x0;
    if (cVar4 == 0) {
      allocateAndGetProgramDeviceList(this,program,&numDevices,&deviceList);
    }
    while( true ) {
      if ((numDevices == 0) || (local_10c == 0)) break;
      kernel = kernels[local_10c - 1];
      local_10c = local_10c - 1;
      getShortKernelNameWithHash_abi_cxx11_(&local_50,this,kernel);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &deviceName,"Kernel Info for: ",&local_50);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)rwgs,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &deviceName,"\n");
      log(this,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
      std::__cxx11::string::~string((string *)rwgs);
      std::__cxx11::string::~string((string *)&deviceName);
      uVar7 = 0;
      while( true ) {
        pp_Var1 = deviceList;
        if (numDevices <= uVar7) break;
        deviceName = (char *)0x0;
        local_d8 = uVar7;
        cVar4 = allocateAndGetDeviceInfoString(this,deviceList[uVar7],0x102b,&deviceName);
        args = 0;
        local_dc = (*(this->m_Dispatch).clGetKernelInfo)(kernel,0x1191,4,&args,(size_t *)0x0);
        uVar7 = local_d8;
        pwgsm = 0;
        local_e4 = (*(this->m_Dispatch).clGetKernelWorkGroupInfo)
                             (kernel,pp_Var1[local_d8],0x11b3,8,&pwgsm,(size_t *)0x0);
        wgs = 0;
        local_e0 = cVar4;
        local_e8 = (*(this->m_Dispatch).clGetKernelWorkGroupInfo)
                             (kernel,pp_Var1[uVar7],0x11b0,8,&wgs,(size_t *)0x0);
        rwgs[0] = 0;
        rwgs[1] = 0;
        rwgs[2] = 0;
        cVar4 = (*(this->m_Dispatch).clGetKernelWorkGroupInfo)
                          (kernel,pp_Var1[uVar7],0x11b1,0x18,rwgs,(size_t *)0x0);
        pms = 0;
        local_ec = (*(this->m_Dispatch).clGetKernelWorkGroupInfo)
                             (kernel,pp_Var1[uVar7],0x11b4,8,&pms,(size_t *)0x0);
        lms = 0;
        cVar5 = (*(this->m_Dispatch).clGetKernelWorkGroupInfo)
                          (kernel,pp_Var1[uVar7],0x11b2,8,&lms,(size_t *)0x0);
        sms = 0;
        local_f0 = (*(this->m_Dispatch).clGetKernelWorkGroupInfo)
                             (kernel,pp_Var1[uVar7],0x4109,8,&sms,(size_t *)0x0);
        regCount = 0;
        cVar6 = (*(this->m_Dispatch).clGetKernelWorkGroupInfo)
                          (kernel,pp_Var1[uVar7],0x425b,4,&regCount,(size_t *)0x0);
        pcVar2 = deviceName;
        if (((cVar4 == 0 && local_ec == 0) && cVar5 == 0) &&
            ((local_e4 == 0 && local_e8 == 0) && (local_dc == 0 && local_e0 == 0))) {
          fVar8 = logf(this,__x);
          bVar3 = (this->m_Config).KernelInfoLogging;
          if ((bool)bVar3 == true) {
            fVar8 = logf(this,fVar8);
            bVar3 = (this->m_Config).KernelInfoLogging;
          }
          if (((bVar3 & 1) != 0) || ((this->m_Config).PreferredWorkGroupSizeMultipleLogging == true)
             ) {
            fVar8 = logf(this,fVar8);
            bVar3 = (this->m_Config).KernelInfoLogging;
          }
          if ((bVar3 & 1) != 0) {
            fVar8 = logf(this,fVar8);
            if ((rwgs[0] != 0 || rwgs[1] != 0) || rwgs[2] != 0) {
              fVar8 = logf(this,fVar8);
            }
            fVar8 = logf(this,fVar8);
            fVar8 = logf(this,fVar8);
            if (local_f0 == 0) {
              fVar8 = logf(this,fVar8);
            }
            if (cVar6 == 0) {
              logf(this,fVar8);
            }
          }
          if (pcVar2 != (char *)0x0) goto LAB_0015fd1f;
        }
        else if (deviceName == (char *)0x0) {
          logf(this,__x);
        }
        else {
          logf(this,__x);
LAB_0015fd1f:
          operator_delete__(pcVar2);
        }
        uVar7 = local_d8 + 1;
      }
      std::__cxx11::string::~string((string *)&local_50);
    }
    if (deviceList != (cl_device_id *)0x0) {
      operator_delete__(deviceList);
    }
    pthread_mutex_unlock(local_100);
  }
  return;
}

Assistant:

void CLIntercept::logKernelInfo(
    const cl_kernel* kernels,
    cl_uint numKernels )
{
    if( numKernels > 0 )
    {
        std::lock_guard<std::mutex> lock(m_Mutex);

        cl_int  errorCode = CL_SUCCESS;

        // We can share the program and device list for all kernels.

        cl_kernel   queryKernel = kernels[0];

        // First, get the program for this kernel.
        cl_program  program = NULL;
        if( errorCode == CL_SUCCESS )
        {
            errorCode = dispatch().clGetKernelInfo(
                queryKernel,
                CL_KERNEL_PROGRAM,
                sizeof(program),
                &program,
                NULL );
        }

        // Next, get the list of devices for the program.
        cl_uint         numDevices = 0;
        cl_device_id*   deviceList = NULL;
        if( errorCode == CL_SUCCESS )
        {
            errorCode = allocateAndGetProgramDeviceList(
                program,
                numDevices,
                deviceList );
        }

        // Log the preferred work group size multiple for each kernel,
        // for each device.
        while( numDevices && numKernels-- )
        {
            cl_kernel   kernel = kernels[ numKernels ];

            const std::string& kernelName = getShortKernelNameWithHash(kernel);
            log( "Kernel Info for: " + kernelName + "\n" );

            for( cl_uint i = 0; i < numDevices; i++ )
            {
                char*   deviceName = NULL;
                errorCode = allocateAndGetDeviceInfoString(
                    deviceList[i],
                    CL_DEVICE_NAME,
                    deviceName );

                cl_uint args = 0;
                errorCode |= dispatch().clGetKernelInfo(
                    kernel,
                    CL_KERNEL_NUM_ARGS,
                    sizeof(args),
                    &args,
                    NULL );

                size_t  pwgsm = 0;
                errorCode |= dispatch().clGetKernelWorkGroupInfo(
                    kernel,
                    deviceList[i],
                    CL_KERNEL_PREFERRED_WORK_GROUP_SIZE_MULTIPLE,
                    sizeof(pwgsm),
                    &pwgsm,
                    NULL );
                size_t  wgs = 0;
                errorCode |= dispatch().clGetKernelWorkGroupInfo(
                    kernel,
                    deviceList[i],
                    CL_KERNEL_WORK_GROUP_SIZE,
                    sizeof(wgs),
                    &wgs,
                    NULL );
                size_t  rwgs[3] = {0, 0, 0};
                errorCode |= dispatch().clGetKernelWorkGroupInfo(
                    kernel,
                    deviceList[i],
                    CL_KERNEL_COMPILE_WORK_GROUP_SIZE,
                    sizeof(rwgs),
                    rwgs,
                    NULL );
                cl_ulong pms = 0;
                errorCode |= dispatch().clGetKernelWorkGroupInfo(
                    kernel,
                    deviceList[i],
                    CL_KERNEL_PRIVATE_MEM_SIZE,
                    sizeof(pms),
                    &pms,
                    NULL );
                cl_ulong lms = 0;
                errorCode |= dispatch().clGetKernelWorkGroupInfo(
                    kernel,
                    deviceList[i],
                    CL_KERNEL_LOCAL_MEM_SIZE,
                    sizeof(lms),
                    &lms,
                    NULL );
                cl_ulong sms = 0;
                cl_int errorCode_sms = dispatch().clGetKernelWorkGroupInfo(
                    kernel,
                    deviceList[i],
                    CL_KERNEL_SPILL_MEM_SIZE_INTEL,
                    sizeof(sms),
                    &sms,
                    NULL );
                cl_uint regCount = 0;
                cl_int errorCode_regCount = dispatch().clGetKernelWorkGroupInfo(
                    kernel,
                    deviceList[i],
                    CL_KERNEL_REGISTER_COUNT_INTEL,
                    sizeof(regCount),
                    &regCount,
                    NULL );
                if( errorCode == CL_SUCCESS )
                {
                    logf( "    For device: %s\n",
                        deviceName );
                    if( config().KernelInfoLogging )
                    {
                        logf( "        Num Args: %u\n", args);
                    }
                    if( config().KernelInfoLogging ||
                        config().PreferredWorkGroupSizeMultipleLogging )
                    {
                        logf( "        Preferred Work Group Size Multiple: %zu\n", pwgsm);
                    }
                    if( config().KernelInfoLogging )
                    {
                        logf( "        Max Work Group Size: %zu\n", wgs);
                        if( rwgs[0] != 0 || rwgs[1] != 0 || rwgs[2] != 0 )
                        {
                            logf( "        Required Work Group Size: < %zu, %zu, %zu >\n",
                                rwgs[0], rwgs[1], rwgs[2]);
                        }
                        logf( "        Private Mem Size: %u\n", (cl_uint)pms);
                        logf( "        Local Mem Size: %u\n", (cl_uint)lms);
                        if( errorCode_sms == CL_SUCCESS )
                        {
                            logf( "        Spill Mem Size: %u\n", (cl_uint)sms);
                        }
                        if( errorCode_regCount == CL_SUCCESS )
                        {
                            logf( "        Register Count: %u\n", regCount);
                        }
                    }
                }
                else if( deviceName )
                {
                    logf( "Error querying kernel info for device %s!\n", deviceName );
                }
                else
                {
                    logf( "Error querying kernel info!\n" );
                }

                delete [] deviceName;
            }
        }

        delete [] deviceList;
    }
}